

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
mxx::allreduce<int,std::plus<int>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,mxx *this,size_type in,
          undefined8 n)

{
  allocator_type local_21;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,in,&local_21);
  allreduce<int,std::plus<int>>
            (this,in,(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                     .super__Vector_impl_data._M_start,n);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> allreduce(const T* in, size_t n, Func func, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(n);
    allreduce(in, n, &result[0], func, comm);
    return result;
}